

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O2

void __thiscall SquareMatrix_Basics3_Test::TestBody(SquareMatrix_Basics3_Test *this)

{
  bool bVar1;
  SquareMatrix<3> *pSVar2;
  char *pcVar3;
  char *in_R9;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  array<float,_3> aVar7;
  Vector3<float> VVar8;
  initializer_list<float> v_00;
  AssertionResult gtest_ar_;
  optional<pbrt::SquareMatrix<3>_> inv;
  AssertionResult gtest_ar__2;
  AssertHelper local_110;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar_2;
  AssertHelper local_d0;
  AssertionResult gtest_ar__3;
  undefined8 local_a0;
  float local_98 [2];
  undefined8 local_90;
  float local_88 [2];
  SquareMatrix<3> local_80;
  SquareMatrix<3> m3;
  Tuple3<pbrt::Vector3,_float> local_38;
  array<float,_3> v;
  undefined1 auVar6 [56];
  
  pbrt::SquareMatrix<3>::SquareMatrix(&m3);
  bVar1 = pbrt::SquareMatrix<3>::IsIdentity(&m3);
  gtest_ar_.success_ = bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar_2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&inv,(internal *)&gtest_ar_,(AssertionResult *)"m3.IsIdentity()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x191,(char *)inv.optionalValue._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_80,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_80);
    std::__cxx11::string::~string((string *)&inv);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  inv.optionalValue._0_8_ = 0x3f800000;
  inv.optionalValue._8_8_ = 0;
  inv.optionalValue._16_8_ = 0x3f800000;
  inv.optionalValue._24_8_ = 0;
  inv.optionalValue._32_4_ = 0x3f800000;
  testing::internal::CmpHelperEQ<pbrt::SquareMatrix<3>,pbrt::SquareMatrix<3>>
            ((internal *)&gtest_ar_,"m3","SquareMatrix<3>(1, 0, 0, 0, 1, 0, 0, 0, 1)",&m3,
             (SquareMatrix<3> *)&inv);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&inv);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x193,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&inv);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&inv);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  inv.optionalValue._0_8_ = 0x3f80000000000000;
  inv.optionalValue._8_8_ = 0;
  inv.optionalValue._16_8_ = 0x3f800000;
  inv.optionalValue._24_8_ = 0;
  inv.optionalValue._32_4_ = 0x3f800000;
  testing::internal::CmpHelperNE<pbrt::SquareMatrix<3>,pbrt::SquareMatrix<3>>
            ((internal *)&gtest_ar_,"m3","SquareMatrix<3>(0, 1, 0, 0, 1, 0, 0, 0, 1)",&m3,
             (SquareMatrix<3> *)&inv);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&inv);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x194,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&inv);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&inv);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  inv.optionalValue._0_8_ = 0x40000000;
  inv.optionalValue._8_8_ = 0;
  inv.optionalValue._16_8_ = 0xbf800000;
  inv.optionalValue._24_8_ = 0;
  inv.optionalValue._32_4_ = 0x40400000;
  pbrt::SquareMatrix<3>::SquareMatrix((SquareMatrix<3> *)&gtest_ar_);
  gtest_ar_._0_4_ = 0x40000000;
  testing::internal::CmpHelperEQ<pbrt::SquareMatrix<3>,pbrt::SquareMatrix<3>>
            ((internal *)&gtest_ar_2,"SquareMatrix<3>(2, 0, 0, 0, -1, 0, 0, 0, 3)",
             "SquareMatrix<3>::Diag(2, -1, 3)",(SquareMatrix<3> *)&inv,(SquareMatrix<3> *)&gtest_ar_
            );
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&inv);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x197,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&inv);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&inv);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  gtest_ar_2.success_ = false;
  gtest_ar_2._1_7_ = 0x400000003f8000;
  gtest_ar_2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4080000040400000;
  bVar1 = pbrt::SquareMatrix<3>::IsIdentity((SquareMatrix<3> *)&gtest_ar_2);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&inv,(internal *)&gtest_ar_,(AssertionResult *)"m.IsIdentity()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x19a,(char *)inv.optionalValue._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    std::__cxx11::string::~string((string *)&inv);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_80);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  local_80.m[0][0] = 1.0;
  local_80.m[0][1] = 4.0;
  local_80.m[0][2] = 7.0;
  local_80.m[1][0] = 2.0;
  local_80.m[1][1] = 5.0;
  local_80.m[1][2] = 8.0;
  local_80.m[2][0] = 3.0;
  local_80.m[2][1] = 6.0;
  local_80.m[2][2] = 9.0;
  pbrt::Transpose<3>((SquareMatrix<3> *)&inv,(SquareMatrix<3> *)&gtest_ar_2);
  testing::internal::CmpHelperEQ<pbrt::SquareMatrix<3>,pbrt::SquareMatrix<3>>
            ((internal *)&gtest_ar_,"Transpose(m)","mt",(SquareMatrix<3> *)&inv,&local_80);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&inv);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x19c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&inv);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&inv);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  auVar6 = ZEXT856(0);
  inv.optionalValue._0_8_ = 0xc00000003f800000;
  inv.optionalValue._8_4_ = 0x40800000;
  v_00._M_len = 3;
  v_00._M_array = (iterator)&inv;
  pstd::array<float,_3>::array(&v,v_00);
  aVar7 = pbrt::Mul<pstd::array<float,3>,3,pstd::array<float,3>>((SquareMatrix<3> *)&gtest_ar_2,&v);
  local_88[0] = aVar7.values[2];
  auVar4._0_8_ = aVar7.values._0_8_;
  auVar4._8_56_ = auVar6;
  gtest_ar_._0_4_ = 9;
  local_90 = vmovlps_avx(auVar4._0_16_);
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&inv,"1 - 4 + 12","vt[0]",(int *)&gtest_ar_,(float *)&local_90);
  if (inv.optionalValue.__data[0] == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (inv.optionalValue._8_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)inv.optionalValue._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x1a0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&inv.optionalValue + 8));
  gtest_ar_._0_4_ = 0x12;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&inv,"4 - 10 + 24","vt[1]",(int *)&gtest_ar_,(float *)((long)&local_90 + 4)
            );
  if (inv.optionalValue.__data[0] == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (inv.optionalValue._8_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)inv.optionalValue._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x1a1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&inv.optionalValue + 8));
  gtest_ar_._0_4_ = 0x1b;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&inv,"7 - 16 + 36","vt[2]",(int *)&gtest_ar_,local_88);
  if (inv.optionalValue.__data[0] == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (inv.optionalValue._8_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)inv.optionalValue._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x1a2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&inv.optionalValue + 8));
  auVar6 = ZEXT856(0);
  local_38.x = 1.0;
  local_38.y = -2.0;
  local_38.z = 4.0;
  VVar8 = pbrt::Mul<pbrt::Vector3<float>,3,pbrt::Vector3<float>>
                    ((SquareMatrix<3> *)&gtest_ar_2,(Vector3<float> *)&local_38);
  local_98[0] = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar5._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar5._8_56_ = auVar6;
  gtest_ar_._0_4_ = 9;
  local_a0 = vmovlps_avx(auVar5._0_16_);
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&inv,"1 - 4 + 12","v3t[0]",(int *)&gtest_ar_,(float *)&local_a0);
  if (inv.optionalValue.__data[0] == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (inv.optionalValue._8_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)inv.optionalValue._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x1a6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&inv.optionalValue + 8));
  gtest_ar_._0_4_ = 0x12;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&inv,"4 - 10 + 24","v3t[1]",(int *)&gtest_ar_,
             (float *)((long)&local_a0 + 4));
  if (inv.optionalValue.__data[0] == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (inv.optionalValue._8_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)inv.optionalValue._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x1a7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&inv.optionalValue + 8));
  gtest_ar_._0_4_ = 0x1b;
  testing::internal::CmpHelperEQ<int,float>
            ((internal *)&inv,"7 - 16 + 36","v3t[2]",(int *)&gtest_ar_,local_98);
  if (inv.optionalValue.__data[0] == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (inv.optionalValue._8_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)inv.optionalValue._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x1a8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&inv.optionalValue + 8));
  pbrt::Inverse<3>(&inv,&m3);
  gtest_ar__2.success_ = inv.set;
  gtest_ar__2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (inv.set == false) {
    testing::Message::Message((Message *)&gtest_ar__3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__2,(AssertionResult *)"inv.has_value()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x1ab,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&gtest_ar__3)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__3);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__2.message_);
  pSVar2 = pstd::optional<pbrt::SquareMatrix<3>_>::value(&inv);
  testing::internal::CmpHelperEQ<pbrt::SquareMatrix<3>,pbrt::SquareMatrix<3>>
            ((internal *)&gtest_ar_,"m3","*inv",&m3,pSVar2);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if (gtest_ar_.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x1ac,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&gtest_ar__2)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar__2.success_ = false;
  gtest_ar__2._1_7_ = 0x400000;
  gtest_ar__2.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pbrt::Inverse<3>((optional<pbrt::SquareMatrix<3>_> *)&gtest_ar_,(SquareMatrix<3> *)&gtest_ar__2);
  pstd::optional<pbrt::SquareMatrix<3>_>::operator=
            (&inv,(optional<pbrt::SquareMatrix<3>_> *)&gtest_ar_);
  pstd::optional<pbrt::SquareMatrix<3>_>::~optional((optional<pbrt::SquareMatrix<3>_> *)&gtest_ar_);
  gtest_ar__3.success_ = inv.set;
  gtest_ar__3.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (inv.set == false) {
    testing::Message::Message((Message *)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__3,(AssertionResult *)"inv.has_value()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x1b0,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_110,(Message *)&gtest_ar__4);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar__4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__3.message_);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0x3f0000;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  pSVar2 = pstd::optional<pbrt::SquareMatrix<3>_>::value(&inv);
  testing::internal::CmpHelperEQ<pbrt::SquareMatrix<3>,pbrt::SquareMatrix<3>>
            ((internal *)&gtest_ar__3,"SquareMatrix<3>(0.5, 0, 0, 0, .25, 0, 0, 0, -1)","*inv",
             (SquareMatrix<3> *)&gtest_ar_,pSVar2);
  if (gtest_ar__3.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar__3.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar__3.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x1b1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__3.message_);
  gtest_ar__3.success_ = false;
  gtest_ar__3._1_7_ = 0;
  gtest_ar__3.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x40000000;
  pbrt::Inverse<3>((optional<pbrt::SquareMatrix<3>_> *)&gtest_ar_,(SquareMatrix<3> *)&gtest_ar__3);
  pstd::optional<pbrt::SquareMatrix<3>_>::operator=
            (&inv,(optional<pbrt::SquareMatrix<3>_> *)&gtest_ar_);
  pstd::optional<pbrt::SquareMatrix<3>_>::~optional((optional<pbrt::SquareMatrix<3>_> *)&gtest_ar_);
  gtest_ar__4.success_ = (bool)(inv.set ^ 1);
  gtest_ar__4.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (inv.set != false) {
    testing::Message::Message((Message *)&local_110);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__4,(AssertionResult *)"inv.has_value()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/math_test.cpp"
               ,0x1b5,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_110);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar__4.message_);
  pstd::optional<pbrt::SquareMatrix<3>_>::~optional(&inv);
  return;
}

Assistant:

TEST(SquareMatrix, Basics3) {
    SquareMatrix<3> m3;
    EXPECT_TRUE(m3.IsIdentity());

    EXPECT_EQ(m3, SquareMatrix<3>(1, 0, 0, 0, 1, 0, 0, 0, 1));
    EXPECT_NE(m3, SquareMatrix<3>(0, 1, 0, 0, 1, 0, 0, 0, 1));

    EXPECT_EQ(SquareMatrix<3>(2, 0, 0, 0, -1, 0, 0, 0, 3),
              SquareMatrix<3>::Diag(2, -1, 3));

    SquareMatrix<3> m(1, 2, 3, 4, 5, 6, 7, 8, 9);
    EXPECT_FALSE(m.IsIdentity());
    SquareMatrix<3> mt(1, 4, 7, 2, 5, 8, 3, 6, 9);
    EXPECT_EQ(Transpose(m), mt);

    pstd::array<Float, 3> v{1, -2, 4};
    pstd::array<Float, 3> vt = m * v;
    EXPECT_EQ(1 - 4 + 12, vt[0]);
    EXPECT_EQ(4 - 10 + 24, vt[1]);
    EXPECT_EQ(7 - 16 + 36, vt[2]);

    Vector3f v3(1, -2, 4);
    Vector3f v3t = m * v3;
    EXPECT_EQ(1 - 4 + 12, v3t[0]);
    EXPECT_EQ(4 - 10 + 24, v3t[1]);
    EXPECT_EQ(7 - 16 + 36, v3t[2]);

    pstd::optional<SquareMatrix<3>> inv = Inverse(m3);
    EXPECT_TRUE(inv.has_value());
    EXPECT_EQ(m3, *inv);

    SquareMatrix<3> ms(2, 0, 0, 0, 4, 0, 0, 0, -1);
    inv = Inverse(ms);
    EXPECT_TRUE(inv.has_value());
    EXPECT_EQ(SquareMatrix<3>(0.5, 0, 0, 0, .25, 0, 0, 0, -1), *inv);

    SquareMatrix<3> degen(0, 0, 2, 0, 0, 0, 1, 1, 1);
    inv = Inverse(degen);
    EXPECT_FALSE(inv.has_value());
}